

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMap.cpp
# Opt level: O3

int __thiscall llvm::StringMapImpl::init(StringMapImpl *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  StringMapEntryBase **ppSVar2;
  uint uVar3;
  
  uVar1 = (uint)ctx;
  if ((uVar1 & uVar1 - 1) != 0) {
    __assert_fail("(InitSize & (InitSize-1)) == 0 && \"Init Size must be a power of 2 or zero!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/StringMap.cpp"
                  ,0x37,"void llvm::StringMapImpl::init(unsigned int)");
  }
  uVar3 = 0x10;
  if (uVar1 != 0) {
    uVar3 = uVar1;
  }
  this->NumItems = 0;
  this->NumTombstones = 0;
  ppSVar2 = (StringMapEntryBase **)calloc((ulong)(uVar3 + 1),0xc);
  if (ppSVar2 == (StringMapEntryBase **)0x0) {
    report_bad_alloc_error("Allocation failed",true);
  }
  this->TheTable = ppSVar2;
  this->NumBuckets = uVar3;
  ppSVar2[uVar3] = (StringMapEntryBase *)0x2;
  return uVar3;
}

Assistant:

void StringMapImpl::init(unsigned InitSize) {
  assert((InitSize & (InitSize-1)) == 0 &&
         "Init Size must be a power of 2 or zero!");

  unsigned NewNumBuckets = InitSize ? InitSize : 16;
  NumItems = 0;
  NumTombstones = 0;

  TheTable = static_cast<StringMapEntryBase **>(
      safe_calloc(NewNumBuckets+1,
                  sizeof(StringMapEntryBase **) + sizeof(unsigned)));

  // Set the member only if TheTable was successfully allocated
  NumBuckets = NewNumBuckets;

  // Allocate one extra bucket, set it to look filled so the iterators stop at
  // end.
  TheTable[NumBuckets] = (StringMapEntryBase*)2;
}